

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_NewClass(JSRuntime *rt,JSClassID class_id,JSClassDef *class_def)

{
  char *__s;
  JSAtom name;
  int iVar1;
  size_t sVar2;
  int in_ECX;
  
  __s = class_def->class_name;
  sVar2 = strlen(__s);
  name = __JS_FindAtom(rt,__s,(long)(int)sVar2,in_ECX);
  if ((name == 0) && (name = __JS_NewAtomInit(rt,class_def->class_name,(int)sVar2,1), name == 0)) {
    return -1;
  }
  iVar1 = JS_NewClass1(rt,class_id,class_def,name);
  JS_FreeAtomRT(rt,name);
  return iVar1;
}

Assistant:

int JS_NewClass(JSRuntime *rt, JSClassID class_id, const JSClassDef *class_def)
{
    int ret, len;
    JSAtom name;

    len = strlen(class_def->class_name);
    name = __JS_FindAtom(rt, class_def->class_name, len, JS_ATOM_TYPE_STRING);
    if (name == JS_ATOM_NULL) {
        name = __JS_NewAtomInit(rt, class_def->class_name, len, JS_ATOM_TYPE_STRING);
        if (name == JS_ATOM_NULL)
            return -1;
    }
    ret = JS_NewClass1(rt, class_id, class_def, name);
    JS_FreeAtomRT(rt, name);
    return ret;
}